

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

bool parse_pattern(GlobalVars *gv,char *keyword,char **fpat,char ***spatlist)

{
  size_t size;
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  char *patternlist [64];
  undefined8 local_238 [65];
  
  gv->scriptflags = gv->scriptflags & 0xf8;
  iVar2 = strcmp(keyword,"KEEP");
  if (iVar2 == 0) {
    keyword = getarg('\x05');
    if (keyword != (char *)0x0) {
      cVar1 = getchr();
      if (cVar1 != '(') goto LAB_001125bf;
      gv->scriptflags = gv->scriptflags | 1;
      goto LAB_0011240a;
    }
LAB_0011259b:
    pcVar7 = scriptname;
    uVar5 = getlineno();
    error(0x4e,pcVar7,(ulong)uVar5);
  }
  else {
LAB_0011240a:
    iVar2 = strcmp(keyword,"SORT");
    if (iVar2 == 0) {
      keyword = getarg('\x05');
      if (keyword == (char *)0x0) goto LAB_0011259b;
      cVar1 = getchr();
      if (cVar1 != '(') {
LAB_001125bf:
        pcVar7 = scriptname;
        uVar5 = getlineno();
        error(0x42,pcVar7,(ulong)uVar5,0x28);
        back(1);
        return 0;
      }
      gv->scriptflags = gv->scriptflags | 2;
    }
    sVar6 = strlen(keyword);
    pcVar7 = (char *)alloc(sVar6 + 1);
    *fpat = pcVar7;
    strcpy(pcVar7,keyword);
    if (((gv->scriptflags & 2) == 0) || (bVar3 = endofblock('(',')'), bVar3 != 0)) {
      pcVar7 = getarg('\x05');
      if (pcVar7 == (char *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        do {
          iVar4 = strcmp(pcVar7,"SORT");
          if (iVar4 == 0) {
            cVar1 = getchr();
            pcVar7 = scriptname;
            if (cVar1 != '(') {
              uVar5 = getlineno();
              error(0x42,pcVar7,(ulong)uVar5,0x28);
              back(1);
LAB_001126db:
              free(*fpat);
              return 0;
            }
            pcVar7 = getarg('\x05');
            pcVar8 = scriptname;
            if (pcVar7 == (char *)0x0) {
              uVar5 = getlineno();
              error(0x4e,pcVar8,(ulong)uVar5);
              goto LAB_001126db;
            }
            bVar3 = endofblock('(',')');
            if (bVar3 == 0) {
              pcVar7 = *fpat;
              goto LAB_001126f0;
            }
            gv->scriptflags = gv->scriptflags | 4;
          }
          if (iVar2 < 0x3f) {
            sVar6 = strlen(pcVar7);
            pcVar8 = (char *)alloc(sVar6 + (iVar4 == 0) + 1);
            local_238[iVar2] = pcVar8;
            if (iVar4 == 0) {
              *pcVar8 = '$';
              pcVar8 = pcVar8 + 1;
            }
            strcpy(pcVar8,pcVar7);
            iVar2 = iVar2 + 1;
          }
          else {
            ierror("parse_pattern(): pattern buffer overrun");
          }
          pcVar7 = getarg('\x05');
        } while (pcVar7 != (char *)0x0);
      }
      local_238[iVar2] = 0;
      size = (long)iVar2 * 8 + 8;
      ppcVar9 = (char **)alloc(size);
      *spatlist = ppcVar9;
      memcpy(ppcVar9,local_238,size);
      bVar3 = endofblock('(',')');
      if (bVar3 == 0) {
        pcVar7 = *fpat;
        ppcVar9 = *spatlist;
      }
      else {
        if ((gv->scriptflags & 1) == 0) {
          return 1;
        }
        bVar3 = endofblock('(',')');
        if (bVar3 != 0) {
          return 1;
        }
        pcVar7 = *fpat;
        ppcVar9 = *spatlist;
      }
      free_patterns(pcVar7,ppcVar9);
    }
    else {
      pcVar7 = *fpat;
LAB_001126f0:
      free(pcVar7);
    }
  }
  return 0;
}

Assistant:

static bool parse_pattern(struct GlobalVars *gv,char *keyword,
                          char **fpat,char ***spatlist)
/* parse file/section-pattern and allocate pattern-lists */
{
  const char *sortcmd = "SORT";
  char *patternlist[64];   /* yes... it's ugly :| */
  int pcnt = 0;
  bool sortsec;

  gv->scriptflags &= ~(LDSF_KEEP | LDSF_SORTFIL | LDSF_SORTSEC);
  if (!strcmp(keyword,"KEEP")) {
    if (keyword = getpattern()) {
      if (getchr() != '(') {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        return FALSE;
      }
    }
    else {
      error(78,scriptname,getlineno());   /* missing argument */
      return FALSE;
    }
    gv->scriptflags |= LDSF_KEEP;
  }

  if (!strcmp(keyword,sortcmd)) {
    if (keyword = getpattern()) {
      if (getchr() != '(') {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        return FALSE;
      }
    }
    else {
      error(78,scriptname,getlineno());   /* missing argument */
      return FALSE;
    }
    gv->scriptflags |= LDSF_SORTFIL;
  }
  *fpat = alloc(strlen(keyword)+1);
  strcpy(*fpat,keyword);
  if (gv->scriptflags & LDSF_SORTFIL) {
    if (!endofblock('(',')')) {
      free(*fpat);
      return FALSE;
    }
  }

  while (keyword = getpattern()) {
    sortsec = FALSE;
    if (!strcmp(keyword,sortcmd)) {
      if (getchr() == '(') {
        if (!(keyword = getpattern())) {
          error(78,scriptname,getlineno());   /* missing argument */
          free(*fpat);
          return FALSE;
        }
      }
      else {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        free(*fpat);
        return FALSE;
      }
      if (!endofblock('(',')')) {
        free(*fpat);
        return FALSE;
      }
      gv->scriptflags |= LDSF_SORTSEC;
      sortsec = TRUE;
    }

    if (pcnt < 63) {
      patternlist[pcnt] = alloc(strlen(keyword) + (sortsec ? 2 : 1));
      if (sortsec) {
        *patternlist[pcnt] = '$';   /* indicate sort-request */
        strcpy(patternlist[pcnt]+1,keyword);
      }
      else
        strcpy(patternlist[pcnt],keyword);
      pcnt++;
    }
    else
      ierror("parse_pattern(): pattern buffer overrun");
  }

  patternlist[pcnt++] = NULL;
  *spatlist = alloc(pcnt * sizeof(char *));
  memcpy(*spatlist,patternlist,pcnt*sizeof(char *));

  if (!endofblock('(',')')) {
    free_patterns(*fpat,*spatlist);
    return FALSE;
  }
  if (gv->scriptflags & LDSF_KEEP) {
    if (!endofblock('(',')')) {
      free_patterns(*fpat,*spatlist);
      return FALSE;
    }
  }
  return TRUE;
}